

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::form::clear(form *this)

{
  size_type sVar1;
  reference pvVar2;
  long in_RDI;
  uint i;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
            ::size((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                    *)(in_RDI + 8));
    if (sVar1 <= local_c) break;
    pvVar2 = std::
             vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ::operator[]((vector<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                           *)(in_RDI + 8),(ulong)local_c);
    (*pvVar2->first->_vptr_base_form[3])();
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void form::clear()
{
	for(unsigned int i=0;i<elements_.size();i++) {
		elements_[i].first->clear();
	}
}